

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt_string.c
# Opt level: O0

int dropt_vssprintf(dropt_stringstream *ss,dropt_char *format,__va_list_tag *args)

{
  size_t local_60;
  size_t newSize;
  size_t available;
  va_list argsCopy;
  uint local_24;
  int n;
  __va_list_tag *args_local;
  dropt_char *format_local;
  dropt_stringstream *ss_local;
  
  if (ss == (dropt_stringstream *)0x0) {
    __assert_fail("ss != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_string.c"
                  ,0x282,
                  "int dropt_vssprintf(dropt_stringstream *, const dropt_char *, struct __va_list_tag *)"
                 );
  }
  if (format == (dropt_char *)0x0) {
    __assert_fail("format != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_string.c"
                  ,0x283,
                  "int dropt_vssprintf(dropt_stringstream *, const dropt_char *, struct __va_list_tag *)"
                 );
  }
  argsCopy[0].overflow_arg_area = args->reg_save_area;
  available._0_4_ = args->gp_offset;
  available._4_4_ = args->fp_offset;
  argsCopy[0]._0_8_ = args->overflow_arg_area;
  local_24 = dropt_vsnprintf((dropt_char *)0x0,0,format,(__va_list_tag *)&available);
  if (0 < (int)local_24) {
    newSize = dropt_ssgetfreespace(ss);
    if (newSize <= local_24) {
      if (ss->maxSize + (long)(int)local_24 < ss->maxSize * 2) {
        local_60 = ss->maxSize << 1;
      }
      else {
        local_60 = ss->maxSize + (long)(int)local_24;
      }
      dropt_ssresize(ss,local_60);
      newSize = dropt_ssgetfreespace(ss);
    }
    if (newSize == 0) {
      __assert_fail("available > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_string.c"
                    ,0x296,
                    "int dropt_vssprintf(dropt_stringstream *, const dropt_char *, struct __va_list_tag *)"
                   );
    }
    local_24 = dropt_vsnprintf(ss->string + ss->used,newSize,format,args);
    if (newSize <= local_24) {
      local_24 = 0xffffffff;
    }
    if (0 < (int)local_24) {
      ss->used = (long)(int)local_24 + ss->used;
    }
  }
  return local_24;
}

Assistant:

int
dropt_vssprintf(dropt_stringstream* ss, const dropt_char* format, va_list args)
{
    int n;
    va_list argsCopy;
    assert(ss != NULL);
    assert(format != NULL);

    va_copy(argsCopy, args);
    n = dropt_vsnprintf(NULL, 0, format, argsCopy);
    va_end(argsCopy);

    if (n > 0)
    {
        size_t available = dropt_ssgetfreespace(ss);
        if ((unsigned int) n >= available)
        {
            /* It's possible that `newSize < ss->maxSize` if
             * `GROWN_STRINGSTREAM_BUFFER_SIZE()` overflows, but it should be
             * safe since we'll recompute the available space.
             */
            size_t newSize = GROWN_STRINGSTREAM_BUFFER_SIZE(ss->maxSize, n);
            dropt_ssresize(ss, newSize);
            available = dropt_ssgetfreespace(ss);
        }
        assert(available > 0); /* Space always is reserved for NUL. */

        /* `snprintf`'s family of functions return the number of characters
         * that would be output with a sufficiently large buffer, excluding
         * `NUL`.
         */
        n = dropt_vsnprintf(ss->string + ss->used, available, format, args);

        /* We couldn't allocate enough space. */
        if ((unsigned int) n >= available) { n = -1; }

        if (n > 0) { ss->used += n; }
    }
    return n;
}